

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O1

ssize_t __thiscall pstack::MemReader::read(MemReader *this,int __fd,void *__buf,size_t __nbytes)

{
  void *pvVar1;
  Exception *this_00;
  undefined4 in_register_00000034;
  ulong uVar2;
  Exception local_1c0;
  
  uVar2 = CONCAT44(in_register_00000034,__fd);
  pvVar1 = (void *)(this->len - uVar2);
  if (uVar2 <= this->len) {
    if (pvVar1 < __buf) {
      __buf = pvVar1;
    }
    memcpy((void *)__nbytes,this->data + uVar2,(size_t)__buf);
    return (ssize_t)__buf;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x1a0);
  memset(&local_1c0,0,0x1a0);
  Exception::Exception(&local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1c0.str,"read past end of memory",0x17);
  Exception::Exception(this_00,&local_1c0);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

size_t
MemReader::read(Off off, size_t count, char *ptr) const
{
    if (off > Off(len))
        throw (Exception() << "read past end of memory");
    size_t rc = std::min(count, len - size_t(off));
    memcpy(ptr, ptroff(data, off), rc);
    return rc;
}